

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
::parse_flags(basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
              *this,format_specs *spec,iterator *it)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  
  pbVar3 = (byte *)it->ptr_;
  pbVar2 = (byte *)it->end_;
  it->ptr_ = (char *)(pbVar3 + 1);
  if (pbVar3 != pbVar2) {
    bVar4 = (spec->super_core_format_specs).flags;
    do {
      bVar1 = *pbVar3;
      if (bVar1 < 0x2b) {
        if (bVar1 == 0x20) {
          bVar4 = bVar4 | 1;
        }
        else {
          if (bVar1 != 0x23) break;
          bVar4 = bVar4 | 8;
        }
LAB_00133a57:
        (spec->super_core_format_specs).flags = bVar4;
      }
      else {
        if (bVar1 == 0x2b) {
          bVar4 = bVar4 | 3;
          goto LAB_00133a57;
        }
        if (bVar1 == 0x30) {
          (spec->super_align_spec).fill_ = L'0';
        }
        else {
          if (bVar1 != 0x2d) break;
          (spec->super_align_spec).align_ = ALIGN_LEFT;
        }
      }
      it->ptr_ = (char *)(pbVar3 + 2);
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar2);
  }
  it->ptr_ = (char *)pbVar3;
  return;
}

Assistant:

void basic_printf_context<OutputIt, Char, AF>::parse_flags(
    format_specs &spec, iterator &it) {
  for (;;) {
    switch (*it++) {
      case '-':
        spec.align_ = ALIGN_LEFT;
        break;
      case '+':
        spec.flags |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '0':
        spec.fill_ = '0';
        break;
      case ' ':
        spec.flags |= SIGN_FLAG;
        break;
      case '#':
        spec.flags |= HASH_FLAG;
        break;
      default:
        --it;
        return;
    }
  }
}